

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

_Bool Curl_conn_cf_discard_sub
                (Curl_cfilter *cf,Curl_cfilter *discard,Curl_easy *data,_Bool destroy_always)

{
  bool bVar1;
  Curl_cfilter **ppCStack_30;
  _Bool found;
  Curl_cfilter **pprev;
  _Bool destroy_always_local;
  Curl_easy *data_local;
  Curl_cfilter *discard_local;
  Curl_cfilter *cf_local;
  
  ppCStack_30 = &cf->next;
  bVar1 = false;
  do {
    if (*ppCStack_30 == (Curl_cfilter *)0x0) {
LAB_0011dcd8:
      if ((bVar1) || (destroy_always)) {
        discard->next = (Curl_cfilter *)0x0;
        (*(code *)discard->cft->destroy)(discard,data);
        (*Curl_cfree)(discard);
      }
      return bVar1;
    }
    if (*ppCStack_30 == cf) {
      *ppCStack_30 = discard->next;
      discard->next = (Curl_cfilter *)0x0;
      bVar1 = true;
      goto LAB_0011dcd8;
    }
    ppCStack_30 = &(*ppCStack_30)->next;
  } while( true );
}

Assistant:

bool Curl_conn_cf_discard_sub(struct Curl_cfilter *cf,
                              struct Curl_cfilter *discard,
                              struct Curl_easy *data,
                              bool destroy_always)
{
  struct Curl_cfilter **pprev = &cf->next;
  bool found = FALSE;

  /* remove from sub-chain and destroy */
  DEBUGASSERT(cf);
  while(*pprev) {
    if(*pprev == cf) {
      *pprev = discard->next;
      discard->next = NULL;
      found = TRUE;
      break;
    }
    pprev = &((*pprev)->next);
  }
  if(found || destroy_always) {
    discard->next = NULL;
    discard->cft->destroy(discard, data);
    free(discard);
  }
  return found;
}